

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool __thiscall Times<0,_1,_1>::propagate(Times<0,_1,_1> *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  IntVar *pIVar12;
  IntVar *pIVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  
  pIVar13 = (this->x).var;
  pIVar12 = (this->y).var;
  iVar7 = (pIVar13->min).v;
  iVar5 = (pIVar13->max).v;
  lVar11 = (long)iVar5;
  iVar4 = (pIVar12->max).v;
  lVar10 = -(long)iVar4;
  iVar3 = (pIVar12->min).v;
  pIVar12 = (this->z).var;
  lVar14 = (long)(pIVar12->max).v;
  iVar6 = -(pIVar12->min).v;
  lVar15 = -lVar14;
  lVar16 = lVar10 * iVar7;
  lVar14 = lVar16 + lVar14;
  if (lVar14 != 0 && SBORROW8(lVar16,lVar15) == lVar14 < 0) {
    if (so.lazy) {
      iVar1 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[8])(pIVar13);
      uVar2 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar9 = (ulong)uVar2 << 0x20 | (long)iVar1 << 2 | 3;
      pIVar12 = (this->z).var;
    }
    else {
      uVar9 = 0;
    }
    iVar1 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[0xf])(pIVar12,-lVar16,uVar9);
    if ((char)iVar1 == '\0') {
      return false;
    }
  }
  lVar14 = -(long)iVar3;
  lVar16 = lVar14 * lVar11;
  if ((lVar16 < 500000000) &&
     (pIVar13 = (this->z).var, lVar8 = (long)(pIVar13->min).v,
     SBORROW8(lVar16,-lVar8) != lVar16 + lVar8 < 0)) {
    if (so.lazy == true) {
      iVar1 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar2 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar9 = (ulong)uVar2 << 0x20 | (long)iVar1 << 2 | 3;
      pIVar13 = (this->z).var;
    }
    else {
      uVar9 = 0;
    }
    iVar1 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[0xe])(pIVar13,-lVar16,uVar9);
    if ((char)iVar1 == '\0') {
      return false;
    }
  }
  if (iVar3 < 0) {
    lVar14 = (lVar15 + lVar14 + -1) / lVar14;
    pIVar13 = (this->x).var;
    if ((pIVar13->min).v < lVar14) {
      if (so.lazy == true) {
        iVar3 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
        uVar2 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
        uVar9 = (ulong)uVar2 << 0x20 | (long)iVar3 << 2 | 3;
        pIVar13 = (this->x).var;
      }
      else {
        uVar9 = 0;
      }
      iVar3 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[0xe])(pIVar13,lVar14,uVar9);
      if ((char)iVar3 == '\0') {
        return false;
      }
    }
  }
  if (iVar4 < 0) {
    iVar4 = iVar6 / (int)lVar10;
    pIVar13 = (this->x).var;
    if (iVar4 < (pIVar13->max).v) {
      if (so.lazy == true) {
        iVar3 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
        uVar2 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
        uVar9 = (ulong)uVar2 << 0x20 | (long)iVar3 << 2 | 3;
        pIVar13 = (this->x).var;
      }
      else {
        uVar9 = 0;
      }
      iVar4 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[0xf])
                        (pIVar13,(long)iVar4,uVar9);
      if ((char)iVar4 == '\0') {
        return false;
      }
    }
  }
  if (0 < iVar5) {
    lVar11 = (lVar15 + lVar11 + -1) / lVar11;
    pIVar13 = (this->y).var;
    lVar14 = (long)(pIVar13->max).v;
    lVar10 = -lVar14;
    if (lVar11 != lVar10 && SBORROW8(lVar11,lVar10) == lVar11 + lVar14 < 0) {
      if (so.lazy == true) {
        iVar5 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
        uVar2 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
        uVar9 = (ulong)uVar2 << 0x20 | (long)iVar5 << 2 | 3;
        pIVar13 = (this->y).var;
      }
      else {
        uVar9 = 0;
      }
      iVar5 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[0xf])(pIVar13,-lVar11,uVar9);
      if ((char)iVar5 == '\0') {
        return false;
      }
    }
  }
  if (iVar7 < 1) {
    return true;
  }
  iVar6 = iVar6 / iVar7;
  pIVar13 = (this->y).var;
  iVar7 = (pIVar13->min).v;
  if (SBORROW4(iVar6,-iVar7) != iVar6 + iVar7 < 0) {
    if (so.lazy == true) {
      iVar7 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar2 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar9 = (ulong)uVar2 << 0x20 | (long)iVar7 << 2 | 3;
      pIVar13 = (this->y).var;
    }
    else {
      uVar9 = 0;
    }
    iVar7 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[0xe])
                      (pIVar13,-(long)iVar6,uVar9,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool propagate() override {
		const int64_t x_min = x.getMin();
		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();
		const int64_t y_max = y.getMax();
		const int64_t z_min = z.getMin();
		const int64_t z_max = z.getMax();

		// z >= x.min * y.min
		setDom(z, setMin, x_min * y_min, x.getMinLit(), y.getMinLit());
		// z <= x.max * y.max
		if (x_max * y_max < IntVar::max_limit) {
			setDom(z, setMax, x_max * y_max, x.getMaxLit(), y.getMaxLit());
		}

		// x >= ceil(z.min / y.max)
		if (y_max >= 1) {
			setDom(x, setMin, (z_min + y_max - 1) / y_max, y.getMaxLit(), z.getMinLit());
		}

		// x <= floor(z.max / y.min)
		if (y_min >= 1) {
			setDom(x, setMax, z_max / y_min, y.getMinLit(), z.getMaxLit());
		}

		// y >= ceil(z.min / x.max)
		if (x_max >= 1) {
			setDom(y, setMin, (z_min + x_max - 1) / x_max, x.getMaxLit(), z.getMinLit());
		}

		// y <= floor(z.max / x.min)
		if (x_min >= 1) {
			setDom(y, setMax, z_max / x_min, x.getMinLit(), z.getMaxLit());
		}

		return true;
	}